

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQClass::Mark(SQClass *this,SQCollectable **chain)

{
  SQClass *pSVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar2) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar2 | 0x80000000;
    (*(this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
      [4])();
    pSVar1 = this->_base;
    if (pSVar1 != (SQClass *)0x0) {
      (*(pSVar1->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])(pSVar1,chain);
    }
    SQSharedState::MarkObject(&this->_attributes,(SQCollectable_conflict **)chain);
    if ((this->_defaultvalues)._size != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)
                   ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type + lVar3),
                   (SQCollectable_conflict **)chain);
        SQSharedState::MarkObject
                  ((SQObjectPtr *)
                   ((long)&(((this->_defaultvalues)._vals)->attrs).super_SQObject._type + lVar3),
                   (SQCollectable_conflict **)chain);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar2 < (this->_defaultvalues)._size);
    }
    if ((this->_methods)._size != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)
                   ((long)&(((this->_methods)._vals)->val).super_SQObject._type + lVar3),
                   (SQCollectable_conflict **)chain);
        SQSharedState::MarkObject
                  ((SQObjectPtr *)
                   ((long)&(((this->_methods)._vals)->attrs).super_SQObject._type + lVar3),
                   (SQCollectable_conflict **)chain);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar2 < (this->_methods)._size);
    }
    lVar3 = 0x70;
    do {
      SQSharedState::MarkObject
                ((SQObjectPtr *)
                 ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                         super_SQRefCounted._vptr_SQRefCounted + lVar3),
                 (SQCollectable_conflict **)chain);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 400);
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQClass::Mark(SQCollectable **chain)
{
    START_MARK()
        _members->Mark(chain);
        if(_base) _base->Mark(chain);
        SQSharedState::MarkObject(_attributes, chain);
        for(SQUnsignedInteger i =0; i< _defaultvalues.size(); i++) {
            SQSharedState::MarkObject(_defaultvalues[i].val, chain);
            SQSharedState::MarkObject(_defaultvalues[i].attrs, chain);
        }
        for(SQUnsignedInteger j =0; j< _methods.size(); j++) {
            SQSharedState::MarkObject(_methods[j].val, chain);
            SQSharedState::MarkObject(_methods[j].attrs, chain);
        }
        for(SQUnsignedInteger k =0; k< MT_LAST; k++) {
            SQSharedState::MarkObject(_metamethods[k], chain);
        }
    END_MARK()
}